

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer.c
# Opt level: O1

void once_cb(uv_timer_t *handle)

{
  int iVar1;
  uv_loop_t *loop;
  char *handle_00;
  undefined8 in_R9;
  
  handle_00 = "ONCE_CB %d\n";
  printf("ONCE_CB %d\n",(ulong)(uint)once_cb_called);
  if (handle == (uv_timer_t *)0x0) {
    once_cb_cold_2();
  }
  else {
    handle_00 = (char *)handle;
    iVar1 = uv_is_active((uv_handle_t *)handle);
    if (iVar1 == 0) {
      once_cb_called = once_cb_called + 1;
      uv_close((uv_handle_t *)handle,once_close_cb);
      loop = uv_default_loop();
      uv_update_time(loop);
      return;
    }
  }
  once_cb_cold_1();
  puts("REPEAT_CB");
  if ((uv_timer_t *)handle_00 == (uv_timer_t *)0x0) {
    repeat_cb_cold_2();
  }
  else {
    iVar1 = uv_is_active((uv_handle_t *)handle_00);
    if (iVar1 == 1) {
      repeat_cb_called = repeat_cb_called + 1;
      if (repeat_cb_called == 5) {
        uv_close((uv_handle_t *)handle_00,repeat_close_cb);
        return;
      }
      return;
    }
  }
  repeat_cb_cold_1();
  fprintf(_stderr,"Fatal error in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-timer.c"
          ,0x56,"never_cb should never be called",in_R9,handle_00,handle);
  fflush(_stderr);
  abort();
}

Assistant:

static void once_cb(uv_timer_t* handle) {
  printf("ONCE_CB %d\n", once_cb_called);

  ASSERT(handle != NULL);
  ASSERT(0 == uv_is_active((uv_handle_t*) handle));

  once_cb_called++;

  uv_close((uv_handle_t*)handle, once_close_cb);

  /* Just call this randomly for the code coverage. */
  uv_update_time(uv_default_loop());
}